

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

void __thiscall
S2Loop::S2Loop(S2Loop *this,vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices,
              S2Debug override)

{
  S2Debug override_local;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices_local;
  S2Loop *this_local;
  
  S2Region::S2Region(&this->super_S2Region);
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Loop_0062e2c0;
  this->depth_ = 0;
  this->num_vertices_ = 0;
  this->vertices_ = (S2Point *)0x0;
  this->owns_vertices_ = false;
  this->s2debug_override_ = override;
  this->origin_inside_ = false;
  S2LatLngRect::S2LatLngRect(&this->bound_);
  S2LatLngRect::S2LatLngRect(&this->subregion_bound_);
  MutableS2ShapeIndex::MutableS2ShapeIndex(&this->index_);
  Init(this,vertices);
  return;
}

Assistant:

S2Loop::S2Loop(const vector<S2Point>& vertices,
               S2Debug override)
  : s2debug_override_(override) {
  Init(vertices);
}